

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RtreeDValue cellMargin(Rtree *pRtree,RtreeCell *p)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  uVar1 = (ulong)pRtree->nDim2 + 2;
  dVar2 = 0.0;
  do {
    if (pRtree->eCoordType == '\0') {
      dVar3 = (double)(float)*(undefined8 *)(p->aCoord + (uVar1 - 4));
      dVar4 = (double)(float)((ulong)*(undefined8 *)(p->aCoord + (uVar1 - 4)) >> 0x20);
    }
    else {
      dVar3 = (double)(int)*(undefined8 *)(p->aCoord + (uVar1 - 4));
      dVar4 = (double)(int)((ulong)*(undefined8 *)(p->aCoord + (uVar1 - 4)) >> 0x20);
    }
    dVar2 = dVar2 + (dVar4 - dVar3);
    uVar1 = uVar1 - 2;
  } while (3 < uVar1);
  return dVar2;
}

Assistant:

static RtreeDValue cellMargin(Rtree *pRtree, RtreeCell *p){
  RtreeDValue margin = 0;
  int ii = pRtree->nDim2 - 2;
  do{
    margin += (DCOORD(p->aCoord[ii+1]) - DCOORD(p->aCoord[ii]));
    ii -= 2;
  }while( ii>=0 );
  return margin;
}